

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O1

void __thiscall ixy::IxgbeDevice::init_rx(IxgbeDevice *this)

{
  value_type *__x;
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  dma_memory dVar7;
  shared_ptr<ixy::Mempool> pool;
  dma_memory mem;
  undefined1 local_92 [10];
  pointer local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  char *local_78;
  code *local_70;
  Mempool *pMStack_68;
  long local_60;
  undefined1 local_58 [16];
  dma_memory local_48;
  vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_> *local_38;
  
  if (0x2fff < this->len - 4) {
    if ((0x2fff < this->len - 4) &&
       (*(uint *)(this->addr + 0x3000) = *(uint *)(this->addr + 0x3000) & 0xfffffffe,
       0x3bff < this->len - 4)) {
      puVar1 = this->addr;
      puVar1[0x3c00] = '\0';
      puVar1[0x3c01] = '\0';
      puVar1[0x3c02] = '\x02';
      puVar1[0x3c03] = '\0';
      uVar4 = 0x3c04;
      do {
        if (this->len - 4 < uVar4) goto LAB_00106e92;
        puVar1 = this->addr + uVar4;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar4 = uVar4 + 4;
      } while (uVar4 != 0x3c20);
      if (this->len - 4 < 0x4240) goto LAB_00106eb1;
      if (0x423f < this->len - 4) {
        *(uint *)(this->addr + 0x4240) = *(uint *)(this->addr + 0x4240) | 2;
        if (this->len - 4 < 0x2f00) goto LAB_00106eb1;
        if (0x2eff < this->len - 4) {
          *(uint *)(this->addr + 0x2f00) = *(uint *)(this->addr + 0x2f00) | 2;
          if (this->len - 4 < 0x5080) goto LAB_00106eb1;
          if (0x507f < this->len - 4) {
            *(uint *)(this->addr + 0x5080) = *(uint *)(this->addr + 0x5080) | 0x400;
            local_92._0_2_ = 0;
            if (this->num_rx_queues != 0) {
              local_38 = &this->rx_queues;
              __x = (value_type *)(local_92 + 2);
              do {
                local_88 = (pointer)0x10d436;
                local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_92;
                debug<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>>
                          ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                           ,0x84,"init_rx",
                           (LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>_>
                            *)__x);
                if ((ushort)local_92._0_2_ < 0x10) {
                  uVar2 = (uint)(ushort)local_92._0_2_ * 4 + 0x2100;
                }
                else {
                  uVar2 = (uint)(ushort)local_92._0_2_ * 0x40;
                  if ((ushort)local_92._0_2_ < 0x40) {
                    uVar2 = uVar2 | 0x1014;
                  }
                  else {
                    uVar2 = uVar2 + 0xc014;
                  }
                }
                if ((ushort)local_92._0_2_ < 0x10) {
                  uVar5 = (uint)(ushort)local_92._0_2_ * 4 + 0x2100;
                }
                else if ((ushort)local_92._0_2_ < 0x40) {
                  uVar5 = (uint)(ushort)local_92._0_2_ * 0x40 | 0x1014;
                }
                else {
                  uVar5 = (uint)(ushort)local_92._0_2_ * 0x40 + 0xc014;
                }
                if (this->len - 4 < (ulong)uVar5) goto LAB_00106eb1;
                if (this->len - 4 < (ulong)uVar2) goto LAB_00106e92;
                *(uint *)(this->addr + uVar2) =
                     *(uint *)(this->addr + uVar5) & 0xf1ffffff | 0x2000000;
                if ((ushort)local_92._0_2_ < 0x10) {
                  uVar2 = (uint)(ushort)local_92._0_2_ * 4 + 0x2100;
                }
                else if ((ushort)local_92._0_2_ < 0x40) {
                  uVar2 = (uint)(ushort)local_92._0_2_ * 0x40 | 0x1014;
                }
                else {
                  uVar2 = (uint)(ushort)local_92._0_2_ * 0x40 + 0xc014;
                }
                uVar4 = (ulong)uVar2;
                if (this->len - 4 < uVar4) goto LAB_00106eb1;
                if (this->len - 4 < uVar4) goto LAB_00106e92;
                *(uint *)(this->addr + uVar4) = *(uint *)(this->addr + uVar4) | 0x10000000;
                dVar7 = memory_allocate_dma(0x2000,true);
                local_48 = dVar7;
                memset(dVar7.virt,0xff,0x2000);
                uVar2 = (uint)(ushort)local_92._0_2_ * 0x40 + 0xc000;
                if ((ushort)local_92._0_2_ < 0x40) {
                  uVar2 = (uint)(ushort)local_92._0_2_ * 0x40 | 0x1000;
                }
                if (this->len - 4 < (ulong)uVar2) goto LAB_00106e92;
                *(int *)(this->addr + uVar2) = (int)dVar7.phy;
                uVar2 = (uint)(ushort)local_92._0_2_ * 0x40 + 0xc004;
                if ((ushort)local_92._0_2_ < 0x40) {
                  uVar2 = (uint)(ushort)local_92._0_2_ * 0x40 | 0x1004;
                }
                if (this->len - 4 < (ulong)uVar2) goto LAB_00106e92;
                *(undefined4 *)(this->addr + uVar2) = local_48.phy._4_4_;
                uVar2 = (uint)(ushort)local_92._0_2_ * 0x40 + 0xc008;
                if ((ushort)local_92._0_2_ < 0x40) {
                  uVar2 = (uint)(ushort)local_92._0_2_ * 0x40 | 0x1008;
                }
                if (this->len - 4 < (ulong)uVar2) goto LAB_00106e92;
                puVar1 = this->addr + uVar2;
                puVar1[0] = '\0';
                puVar1[1] = ' ';
                puVar1[2] = '\0';
                puVar1[3] = '\0';
                local_88 = (pointer)0x10d44d;
                local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_92;
                local_78 = " phy addr:  0x";
                local_70 = std::hex;
                pMStack_68 = (Mempool *)&local_48.phy;
                debug<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>,char_const*>,std::ios_base&(&)(std::ios_base&)>,unsigned_long_const&>>
                          ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                           ,0x94,"init_rx",
                           (LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>,_std::ios_base_&(&)(std::ios_base_&)>,_const_unsigned_long_&>_>
                            *)__x);
                local_58._0_8_ = local_48.virt;
                local_88 = (pointer)0x10d44d;
                local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_92;
                local_78 = " virt addr: 0x";
                local_70 = std::hex;
                pMStack_68 = (Mempool *)local_58;
                debug<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>,char_const*>,std::ios_base&(&)(std::ios_base&)>,unsigned_long_const&>>
                          ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                           ,0x95,"init_rx",
                           (LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>,_std::ios_base_&(&)(std::ios_base_&)>,_const_unsigned_long_&>_>
                            *)__x);
                uVar2 = (uint)(ushort)local_92._0_2_ * 0x40 + 0xc010;
                if ((ushort)local_92._0_2_ < 0x40) {
                  uVar2 = (uint)(ushort)local_92._0_2_ * 0x40 | 0x1010;
                }
                if (this->len - 4 < (ulong)uVar2) goto LAB_00106e92;
                puVar1 = this->addr + uVar2;
                puVar1[0] = '\0';
                puVar1[1] = '\0';
                puVar1[2] = '\0';
                puVar1[3] = '\0';
                uVar2 = (uint)(ushort)local_92._0_2_ * 0x40 + 0xc018;
                if ((ushort)local_92._0_2_ < 0x40) {
                  uVar2 = (uint)(ushort)local_92._0_2_ * 0x40 | 0x1018;
                }
                if (this->len - 4 < (ulong)uVar2) goto LAB_00106e92;
                puVar1 = this->addr + uVar2;
                puVar1[0] = '\0';
                puVar1[1] = '\0';
                puVar1[2] = '\0';
                puVar1[3] = '\0';
                Mempool::allocate((Mempool *)local_58,0x1000,0x800);
                local_92._2_8_ = local_48.virt;
                local_88 = (pointer)local_58._0_8_;
                local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(_Atomic_word *)(local_58._8_8_ + 8) =
                         *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
                    UNLOCK();
                  }
                  else {
                    *(_Atomic_word *)(local_58._8_8_ + 8) =
                         *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
                  }
                }
                local_78 = (char *)CONCAT44(local_78._4_4_,0x200);
                local_70 = (code *)0x0;
                pMStack_68 = (Mempool *)0x0;
                local_60 = 0;
                std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::push_back
                          (local_38,__x);
                if (local_70 != (code *)0x0) {
                  operator_delete(local_70,local_60 - (long)local_70);
                }
                if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
                }
                local_92._0_2_ = local_92._0_2_ + 1;
              } while ((ushort)local_92._0_2_ < this->num_rx_queues);
            }
            if (this->len - 4 < 0x18) goto LAB_00106eb1;
            if (0x17 < this->len - 4) {
              *(uint *)(this->addr + 0x18) = *(uint *)(this->addr + 0x18) | 0x10000;
              if (this->num_rx_queues != 0) {
                uVar2 = 0;
                iVar3 = 0xc00c;
                do {
                  if ((ushort)uVar2 < 0x10) {
                    iVar6 = uVar2 * 4 + 0x2200;
                  }
                  else {
                    iVar6 = iVar3;
                    if ((ushort)uVar2 < 0x40) {
                      iVar6 = uVar2 * 0x40 + 0x100c;
                    }
                  }
                  uVar4 = (ulong)iVar6;
                  if (this->len - 4 < uVar4) goto LAB_00106eb1;
                  if (this->len - 4 < uVar4) goto LAB_00106e92;
                  *(uint *)(this->addr + uVar4) = *(uint *)(this->addr + uVar4) & 0xffffefff;
                  uVar5 = uVar2 + 1;
                  uVar2 = uVar5 & 0xffff;
                  iVar3 = iVar3 + 0x40;
                } while ((ushort)uVar5 < this->num_rx_queues);
              }
              if (this->len - 4 < 0x3000) goto LAB_00106eb1;
              if (0x2fff < this->len - 4) {
                *(uint *)(this->addr + 0x3000) = *(uint *)(this->addr + 0x3000) | 1;
                return;
              }
            }
          }
        }
      }
    }
LAB_00106e92:
    __assert_fail("reg <= len - 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                  ,0x1d2,"void ixy::IxgbeDevice::set_reg32(uint64_t, uint32_t)");
  }
LAB_00106eb1:
  __assert_fail("reg <= len - 4",
                "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                ,0x1cb,"uint32_t ixy::IxgbeDevice::get_reg32(uint64_t)");
}

Assistant:

inline auto IxgbeDevice::get_reg32(uint64_t reg) -> uint32_t {
    assert(reg <= len - 4);

    __asm__ volatile ("" : : : "memory");
    return *(reinterpret_cast<volatile uint32_t *>(addr + reg));
}